

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplashscreen.cpp
# Opt level: O0

void __thiscall
QSplashScreen::QSplashScreen(QSplashScreen *this,QScreen *screen,QPixmap *pixmap,WindowFlags f)

{
  long lVar1;
  QFlags<Qt::WindowType> f_00;
  QSplashScreenPrivate *this_00;
  QScreen *in_RDX;
  QWidgetPrivate *in_RSI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QSplashScreenPrivate *d;
  QWidget *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QSplashScreenPrivate *)operator_new(0x2a0);
  QSplashScreenPrivate::QSplashScreenPrivate(this_00);
  Qt::operator|((enum_type)((ulong)this_00 >> 0x20),(enum_type)this_00);
  f_00 = QFlags<Qt::WindowType>::operator|
                   ((QFlags<Qt::WindowType> *)this_00,
                    (QFlagsStorageHelper<Qt::WindowType,_4>)SUB84(in_RDI,0));
  QWidget::QWidget(in_stack_ffffffffffffffc0,in_RDI,(QWidget *)this_00,
                   (WindowFlags)
                   f_00.super_QFlagsStorageHelper<Qt::WindowType,_4>.
                   super_QFlagsStorage<Qt::WindowType>.i);
  *(undefined ***)in_RDI = &PTR_metaObject_00d1b778;
  *(undefined ***)&in_RDI->field_0x10 = &PTR__QSplashScreen_00d1b930;
  d_func((QSplashScreen *)0x696d43);
  QWidgetPrivate::setScreen(in_RSI,in_RDX);
  setPixmap((QSplashScreen *)in_RDI,(QPixmap *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QSplashScreen::QSplashScreen(QScreen *screen, const QPixmap &pixmap, Qt::WindowFlags f)
    : QWidget(*(new QSplashScreenPrivate()), nullptr, Qt::SplashScreen | Qt::FramelessWindowHint | f)
{
    Q_D(QSplashScreen);
    d->setScreen(screen);
    setPixmap(pixmap);
}